

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall
cmComputeLinkInformation::CheckSharedLibNoSOName(cmComputeLinkInformation *this,string *item)

{
  bool bVar1;
  string soname;
  string file;
  string local_58;
  string local_38;
  
  cmsys::SystemTools::GetFilenameName(&local_38,item);
  bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,local_38._M_dataplus._M_p);
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    bVar1 = cmSystemTools::GuessLibrarySOName(item,&local_58);
    if (!bVar1) {
      AddSharedLibNoSOName(this,item);
      std::__cxx11::string::~string((string *)&local_58);
      bVar1 = true;
      goto LAB_003ee636;
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = false;
LAB_003ee636:
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmComputeLinkInformation::CheckSharedLibNoSOName(std::string const& item)
{
  // This platform will use the path to a library as its soname if the
  // library is given via path and was not built with an soname.  If
  // this is a shared library that might be the case.
  std::string file = cmSystemTools::GetFilenameName(item);
  if(this->ExtractSharedLibraryName.find(file))
    {
    // If we can guess the soname fairly reliably then assume the
    // library has one.  Otherwise assume the library has no builtin
    // soname.
    std::string soname;
    if(!cmSystemTools::GuessLibrarySOName(item, soname))
      {
      this->AddSharedLibNoSOName(item);
      return true;
      }
    }
  return false;
}